

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsObject::QGraphicsObject(QGraphicsObject *this,QGraphicsItem *parent)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItem *in_RDI;
  QGraphicsItem *unaff_retaddr;
  QGraphicsItem *parent_00;
  
  parent_00 = in_RDI;
  QObject::QObject((QObject *)in_RDI,(QObject *)0x0);
  QGraphicsItem::QGraphicsItem(unaff_retaddr,parent_00);
  in_RDI->_vptr_QGraphicsItem = (_func_int **)&PTR_metaObject_00d32488;
  in_RDI[1]._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsObject_00d324f8;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI[1].d_ptr);
  *(ulong *)&pQVar1->field_0x160 =
       *(ulong *)&pQVar1->field_0x160 & 0xfeffffffffffffff | 0x100000000000000;
  return;
}

Assistant:

QGraphicsObject::QGraphicsObject(QGraphicsItem *parent)
        : QGraphicsItem(parent)
{
    QGraphicsItem::d_ptr->isObject = true;
}